

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::peer_log_alert::message_abi_cxx11_(string *__return_storage_ptr__,peer_log_alert *this)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  ulong *local_150;
  endpoint *local_148;
  ulong local_140;
  long lStack_138;
  string local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  peer_alert::message_abi_cxx11_(&local_50,&this->super_peer_alert);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_140 = *puVar5;
    lStack_138 = plVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar5;
    local_150 = (ulong *)*plVar3;
  }
  local_148 = (endpoint *)plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  aux::print_endpoint_abi_cxx11_
            (&local_130,(aux *)&(this->super_peer_alert).super_torrent_alert.field_0x2c,local_148);
  uVar1 = (long)&(local_148->impl_).data_ + local_130._M_string_length;
  uVar8 = 0xf;
  if (local_150 != &local_140) {
    uVar8 = local_140;
  }
  if (uVar8 < uVar1) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar9 = local_130.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
      goto LAB_0017b249;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130._M_dataplus._M_p);
LAB_0017b249:
  local_170 = &local_160;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_160 = *plVar3;
    uStack_158 = puVar4[3];
  }
  else {
    local_160 = *plVar3;
    local_170 = (long *)*puVar4;
  }
  local_168 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_170);
  local_110 = &local_100;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_100 = *plVar6;
    lStack_f8 = plVar3[3];
  }
  else {
    local_100 = *plVar6;
    local_110 = (long *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar3[3];
  }
  else {
    local_e0 = *plVar6;
    local_f0 = (long *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_f0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_b0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_90);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_c0 = *plVar6;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  aux::stack_allocator::ptr
            ((this->super_peer_alert).super_torrent_alert.m_alloc._M_data,
             (allocation_slot)(this->m_str_idx).m_idx);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_d0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string peer_log_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		static aux::array<char const*, 5, direction_t> const mode{
		{ "<==", "==>", "<<<", ">>>", "***" }};
		return peer_alert::message() + " [" + print_endpoint(endpoint) + "] "
			+ mode[direction] + " " + event_type + " [ " + log_message() + " ]";
#endif
	}